

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bmcBmcG.c
# Opt level: O3

Bmcg_Man_t * Bmcg_ManStart(Gia_Man_t *pGia,Bmc_AndPar_t *pPars)

{
  int iVar1;
  uint uVar2;
  Bmcg_Man_t *pBVar3;
  Gia_Man_t *p;
  void **ppvVar4;
  int *piVar5;
  bmcg_sat_solver *s;
  size_t __size;
  long lVar6;
  int iVar7;
  int Lit;
  int local_2c;
  
  pBVar3 = (Bmcg_Man_t *)calloc(1,0x3a8);
  local_2c = 1;
  if (pGia->nRegs < 1) {
    __assert_fail("Gia_ManRegNum(pGia) > 0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/sat/bmc/bmcBmcG.c"
                  ,0x4d,"Bmcg_Man_t *Bmcg_ManStart(Gia_Man_t *, Bmc_AndPar_t *)");
  }
  pBVar3->pPars = pPars;
  pBVar3->pGia = pGia;
  p = Gia_ManStart(pGia->nObjs * 3);
  pBVar3->pFrames = p;
  Gia_ManHashStart(p);
  ppvVar4 = (void **)malloc(8000);
  (pBVar3->vGia2Fr).pArray = ppvVar4;
  (pBVar3->vGia2Fr).nCap = 1000;
  iVar1 = pGia->vCis->nSize;
  if (0 < iVar1) {
    uVar2 = iVar1 * 3;
    piVar5 = (int *)malloc((ulong)uVar2 << 2);
    (pBVar3->vFr2Sat).pArray = piVar5;
    if (piVar5 == (int *)0x0) goto LAB_005790a3;
    (pBVar3->vFr2Sat).nCap = uVar2;
  }
  Vec_IntPush(&pBVar3->vFr2Sat,0);
  iVar1 = pGia->vCis->nSize;
  iVar7 = iVar1 * 3;
  if ((pBVar3->vCiMap).nCap < iVar7) {
    piVar5 = (pBVar3->vCiMap).pArray;
    __size = (long)iVar1 * 0xc;
    if (piVar5 == (int *)0x0) {
      piVar5 = (int *)malloc(__size);
    }
    else {
      piVar5 = (int *)realloc(piVar5,__size);
    }
    (pBVar3->vCiMap).pArray = piVar5;
    if (piVar5 == (int *)0x0) {
LAB_005790a3:
      __assert_fail("p->pArray",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                    ,0x217,"void Vec_IntGrow(Vec_Int_t *, int)");
    }
    (pBVar3->vCiMap).nCap = iVar7;
  }
  if (0 < pBVar3->pPars->nProcs) {
    lVar6 = 0;
    do {
      s = bmcg_sat_solver_start();
      pBVar3->pSats[lVar6] = s;
      bmcg_sat_solver_addvar(s);
      bmcg_sat_solver_addclause(pBVar3->pSats[lVar6],&local_2c,1);
      bmcg_sat_solver_set_stop(pBVar3->pSats[lVar6],&pBVar3->fStopNow);
      lVar6 = lVar6 + 1;
    } while (lVar6 < pBVar3->pPars->nProcs);
  }
  pBVar3->nSatVars = 1;
  return pBVar3;
}

Assistant:

Bmcg_Man_t * Bmcg_ManStart( Gia_Man_t * pGia, Bmc_AndPar_t * pPars )
{
    Bmcg_Man_t * p = ABC_CALLOC( Bmcg_Man_t, 1 ); 
    int i, Lit = Abc_Var2Lit( 0, 1 );
//    opts.conf_limit = pPars->nConfLimit;
    assert( Gia_ManRegNum(pGia) > 0 );
    p->pPars   = pPars;
    p->pGia    = pGia;
    p->pFrames = Gia_ManStart( 3*Gia_ManObjNum(pGia) );  Gia_ManHashStart(p->pFrames);
    p->pClean  = NULL;
//    Vec_PtrFill( &p->vGia2Fr, Gia_ManCountTents(pGia)+1, NULL );
//    for ( i = 0; i < Vec_PtrSize(&p->vGia2Fr); i++ )
//        Vec_PtrWriteEntry( &p->vGia2Fr, i, ABC_FALLOC(int, Gia_ManObjNum(pGia)) );
    Vec_PtrGrow( &p->vGia2Fr, 1000 );  
    Vec_IntGrow( &p->vFr2Sat, 3*Gia_ManCiNum(pGia) );  
    Vec_IntPush( &p->vFr2Sat, 0 );
    Vec_IntGrow( &p->vCiMap, 3*Gia_ManCiNum(pGia) );
    for ( i = 0; i < p->pPars->nProcs; i++ )
    {
        p->pSats[i] = bmcg_sat_solver_start();  
//        p->pSats[i]->SolverType = i;
        bmcg_sat_solver_addvar( p->pSats[i] );
        bmcg_sat_solver_addclause( p->pSats[i], &Lit, 1 );  
        bmcg_sat_solver_set_stop( p->pSats[i], &p->fStopNow );
    }
    p->nSatVars = 1;
    return p;
}